

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall Catch::ConsoleReporter::printTotalsDivider(ConsoleReporter *this,Totals *totals)

{
  bool bVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  size_t *psVar4;
  ostream *poVar5;
  long in_RSI;
  long in_RDI;
  size_t skippedRatio;
  size_t passedRatio;
  size_t failedButOkRatio;
  size_t failedRatio;
  ColourGuard *in_stack_fffffffffffffd68;
  ColourGuard *in_stack_fffffffffffffd70;
  ColourGuard *this_00;
  ColourImpl *in_stack_fffffffffffffd78;
  ColourImpl *this_01;
  undefined8 in_stack_fffffffffffffd80;
  char __c;
  size_type in_stack_fffffffffffffd88;
  size_t __n;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_02;
  allocator<char> local_189;
  string local_188 [32];
  ColourImpl local_168;
  undefined1 local_151 [56];
  allocator<char> local_119;
  string local_118 [55];
  allocator<char> local_e1;
  string local_e0 [55];
  allocator<char> local_a9;
  string local_a8 [55];
  allocator<char> local_71;
  string local_70 [64];
  size_t local_30;
  size_t local_28;
  size_t local_20;
  size_t local_18;
  long local_10;
  
  local_10 = in_RSI;
  uVar2 = Counts::total((Counts *)(in_RSI + 0x20));
  if (uVar2 == 0) {
    this_00 = *(ColourGuard **)(in_RDI + 0x20);
    Detail::unique_ptr<Catch::ColourImpl>::operator->
              ((unique_ptr<Catch::ColourImpl> *)(in_RDI + 0x28));
    this_01 = &local_168;
    ColourImpl::guardColour(this_01,(Code)((ulong)this_00 >> 0x20));
    poVar5 = Catch::operator<<((ostream *)this_00,in_stack_fffffffffffffd68);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,(char)((ulong)poVar5 >> 0x38),
               (allocator<char> *)this_01);
    std::operator<<(poVar5,local_188);
    std::__cxx11::string::~string(local_188);
    std::allocator<char>::~allocator(&local_189);
    ColourImpl::ColourGuard::~ColourGuard(this_00);
  }
  else {
    uVar2 = *(uint64_t *)(local_10 + 0x28);
    uVar3 = Counts::total((Counts *)(local_10 + 0x20));
    local_18 = anon_unknown_26::makeRatio(uVar2,uVar3);
    uVar2 = *(uint64_t *)(local_10 + 0x30);
    uVar3 = Counts::total((Counts *)(local_10 + 0x20));
    local_20 = anon_unknown_26::makeRatio(uVar2,uVar3);
    uVar2 = *(uint64_t *)(local_10 + 0x20);
    uVar3 = Counts::total((Counts *)(local_10 + 0x20));
    local_28 = anon_unknown_26::makeRatio(uVar2,uVar3);
    uVar2 = *(uint64_t *)(local_10 + 0x38);
    uVar3 = Counts::total((Counts *)(local_10 + 0x20));
    local_30 = anon_unknown_26::makeRatio(uVar2,uVar3);
    while (local_18 + local_20 + local_28 + local_30 < 0x4f) {
      psVar4 = anon_unknown_26::findMax(&local_18,&local_20,&local_28,&local_30);
      *psVar4 = *psVar4 + 1;
    }
    while (__c = (char)((ulong)in_stack_fffffffffffffd80 >> 0x38),
          0x4f < local_18 + local_20 + local_28) {
      psVar4 = anon_unknown_26::findMax(&local_18,&local_20,&local_28,&local_30);
      *psVar4 = *psVar4 - 1;
    }
    Detail::unique_ptr<Catch::ColourImpl>::operator->
              ((unique_ptr<Catch::ColourImpl> *)(in_RDI + 0x28));
    ColourImpl::guardColour
              (in_stack_fffffffffffffd78,(Code)((ulong)in_stack_fffffffffffffd70 >> 0x20));
    poVar5 = Catch::operator<<((ostream *)in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,__c,
               (allocator<char> *)in_stack_fffffffffffffd78);
    std::operator<<(poVar5,local_70);
    Detail::unique_ptr<Catch::ColourImpl>::operator->
              ((unique_ptr<Catch::ColourImpl> *)(in_RDI + 0x28));
    ColourImpl::guardColour
              (in_stack_fffffffffffffd78,(Code)((ulong)in_stack_fffffffffffffd70 >> 0x20));
    poVar5 = Catch::operator<<((ostream *)in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,__c,
               (allocator<char> *)in_stack_fffffffffffffd78);
    std::operator<<(poVar5,local_a8);
    std::__cxx11::string::~string(local_a8);
    std::allocator<char>::~allocator(&local_a9);
    ColourImpl::ColourGuard::~ColourGuard(in_stack_fffffffffffffd70);
    std::__cxx11::string::~string(local_70);
    std::allocator<char>::~allocator(&local_71);
    ColourImpl::ColourGuard::~ColourGuard(in_stack_fffffffffffffd70);
    bVar1 = Counts::allPassed((Counts *)(local_10 + 0x20));
    if (bVar1) {
      Detail::unique_ptr<Catch::ColourImpl>::operator->
                ((unique_ptr<Catch::ColourImpl> *)(in_RDI + 0x28));
      ColourImpl::guardColour
                (in_stack_fffffffffffffd78,(Code)((ulong)in_stack_fffffffffffffd70 >> 0x20));
      poVar5 = Catch::operator<<((ostream *)in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,__c,
                 (allocator<char> *)in_stack_fffffffffffffd78);
      std::operator<<(poVar5,local_e0);
      std::__cxx11::string::~string(local_e0);
      std::allocator<char>::~allocator(&local_e1);
      ColourImpl::ColourGuard::~ColourGuard(in_stack_fffffffffffffd70);
    }
    else {
      Detail::unique_ptr<Catch::ColourImpl>::operator->
                ((unique_ptr<Catch::ColourImpl> *)(in_RDI + 0x28));
      ColourImpl::guardColour
                (in_stack_fffffffffffffd78,(Code)((ulong)in_stack_fffffffffffffd70 >> 0x20));
      poVar5 = Catch::operator<<((ostream *)in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,__c,
                 (allocator<char> *)in_stack_fffffffffffffd78);
      std::operator<<(poVar5,local_118);
      std::__cxx11::string::~string(local_118);
      std::allocator<char>::~allocator(&local_119);
      ColourImpl::ColourGuard::~ColourGuard(in_stack_fffffffffffffd70);
    }
    Detail::unique_ptr<Catch::ColourImpl>::operator->
              ((unique_ptr<Catch::ColourImpl> *)(in_RDI + 0x28));
    ColourImpl::guardColour
              (in_stack_fffffffffffffd78,(Code)((ulong)in_stack_fffffffffffffd70 >> 0x20));
    poVar5 = Catch::operator<<((ostream *)in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
    this_02 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_151;
    __n = local_30;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this_02,__n,__c,(allocator<char> *)in_stack_fffffffffffffd78);
    std::operator<<(poVar5,(string *)(local_151 + 1));
    std::__cxx11::string::~string((string *)(local_151 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_151);
    ColourImpl::ColourGuard::~ColourGuard(in_stack_fffffffffffffd70);
  }
  std::operator<<(*(ostream **)(in_RDI + 0x20),'\n');
  return;
}

Assistant:

void ConsoleReporter::printTotalsDivider(Totals const& totals) {
    if (totals.testCases.total() > 0) {
        std::size_t failedRatio = makeRatio(totals.testCases.failed, totals.testCases.total());
        std::size_t failedButOkRatio = makeRatio(totals.testCases.failedButOk, totals.testCases.total());
        std::size_t passedRatio = makeRatio(totals.testCases.passed, totals.testCases.total());
        std::size_t skippedRatio = makeRatio(totals.testCases.skipped, totals.testCases.total());
        while (failedRatio + failedButOkRatio + passedRatio + skippedRatio < CATCH_CONFIG_CONSOLE_WIDTH - 1)
            findMax(failedRatio, failedButOkRatio, passedRatio, skippedRatio)++;
        while (failedRatio + failedButOkRatio + passedRatio > CATCH_CONFIG_CONSOLE_WIDTH - 1)
            findMax(failedRatio, failedButOkRatio, passedRatio, skippedRatio)--;

        m_stream << m_colour->guardColour( Colour::Error )
                 << std::string( failedRatio, '=' )
                 << m_colour->guardColour( Colour::ResultExpectedFailure )
                 << std::string( failedButOkRatio, '=' );
        if ( totals.testCases.allPassed() ) {
            m_stream << m_colour->guardColour( Colour::ResultSuccess )
                     << std::string( passedRatio, '=' );
        } else {
            m_stream << m_colour->guardColour( Colour::Success )
                     << std::string( passedRatio, '=' );
        }
        m_stream << m_colour->guardColour( Colour::Skip )
                 << std::string( skippedRatio, '=' );
    } else {
        m_stream << m_colour->guardColour( Colour::Warning )
                 << std::string( CATCH_CONFIG_CONSOLE_WIDTH - 1, '=' );
    }
    m_stream << '\n';
}